

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddInstruction
          (InstructionBuilder *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *insn)

{
  mapped_type pBVar1;
  Analysis AVar2;
  mapped_type *ppBVar3;
  Analysis AVar4;
  IRContext *pIVar5;
  iterator local_20;
  
  InstructionList::iterator::InsertBefore
            ((iterator *)&local_20,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&this->insert_before_);
  pIVar5 = this->context_;
  AVar4 = pIVar5->valid_analyses_;
  AVar2 = this->preserved_analyses_;
  if (((AVar2 & AVar4 & kAnalysisInstrToBlockMapping) == kAnalysisInstrToBlockMapping) &&
     (pBVar1 = this->parent_, pBVar1 != (mapped_type)0x0)) {
    ppBVar3 = std::__detail::
              _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pIVar5->instr_to_block_,&local_20.node_);
    *ppBVar3 = pBVar1;
    pIVar5 = this->context_;
    AVar4 = pIVar5->valid_analyses_;
    AVar2 = this->preserved_analyses_;
  }
  if (((AVar4 & kAnalysisBegin) != kAnalysisNone) && ((AVar2 & kAnalysisBegin) != kAnalysisNone)) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar5->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               local_20.node_);
  }
  return local_20.node_;
}

Assistant:

Instruction* AddInstruction(std::unique_ptr<Instruction>&& insn) {
    Instruction* insn_ptr = &*insert_before_.InsertBefore(std::move(insn));
    UpdateInstrToBlockMapping(insn_ptr);
    UpdateDefUseMgr(insn_ptr);
    return insn_ptr;
  }